

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase881::run(TestCase881 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar2;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_d70;
  size_t local_d60;
  bool local_d51;
  undefined1 auStack_d50 [7];
  bool _kj_shouldLog_26;
  size_t local_d48;
  size_t local_d40;
  unsigned_long *local_d38;
  undefined1 local_d30 [8];
  DebugComparison<unsigned_long_&,_unsigned_long> _kjCondition_26;
  bool local_ce9;
  undefined1 local_ce8 [7];
  bool _kj_shouldLog_25;
  char (*local_cd0) [7];
  undefined1 local_cc8 [8];
  DebugComparison<const_char_(&)[7],_capnp::Text::Builder> _kjCondition_25;
  int local_c88;
  bool local_c81;
  int64_t iStack_c80;
  bool _kj_shouldLog_24;
  int local_c78;
  DebugExpression<int> local_c74;
  undefined1 local_c70 [8];
  DebugComparison<int,_long> _kjCondition_24;
  bool local_c29;
  undefined1 local_c28 [7];
  bool _kj_shouldLog_23;
  char (*local_c10) [6];
  undefined1 local_c08 [8];
  DebugComparison<const_char_(&)[6],_capnp::Text::Builder> _kjCondition_23;
  int local_bc8;
  bool local_bc1;
  int64_t iStack_bc0;
  bool _kj_shouldLog_22;
  int local_bb8;
  DebugExpression<int> local_bb4;
  undefined1 local_bb0 [8];
  DebugComparison<int,_long> _kjCondition_22;
  Builder sub_3;
  bool local_b41;
  undefined1 local_b40 [7];
  bool _kj_shouldLog_21;
  char (*local_b28) [5];
  undefined1 local_b20 [8];
  DebugComparison<const_char_(&)[5],_capnp::Text::Builder> _kjCondition_21;
  int local_ae0;
  bool local_ad9;
  int64_t iStack_ad8;
  bool _kj_shouldLog_20;
  int local_ad0;
  DebugExpression<int> local_acc;
  undefined1 local_ac8 [8];
  DebugComparison<int,_long> _kjCondition_20;
  bool local_a81;
  undefined1 local_a80 [7];
  bool _kj_shouldLog_19;
  char (*local_a68) [7];
  undefined1 local_a60 [8];
  DebugComparison<const_char_(&)[7],_capnp::Text::Builder> _kjCondition_19;
  int local_a20;
  bool local_a19;
  int64_t iStack_a18;
  bool _kj_shouldLog_18;
  int local_a10;
  DebugExpression<int> local_a0c;
  undefined1 local_a08 [8];
  DebugComparison<int,_long> _kjCondition_18;
  undefined1 local_9c8 [8];
  BuilderFor<capnproto_test::capnp::test::TestNewVersion> newVersion_1;
  bool local_991;
  unsigned_long uStack_990;
  bool _kj_shouldLog_17;
  DebugExpression<unsigned_long> local_988;
  undefined1 local_980 [8];
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition_17;
  size_t local_948;
  size_t size6;
  ArrayPtr<const_char> local_930;
  Builder local_920;
  bool local_901;
  undefined1 local_900 [7];
  bool _kj_shouldLog_16;
  char (*local_8e8) [6];
  undefined1 local_8e0 [8];
  DebugComparison<const_char_(&)[6],_capnp::Text::Builder> _kjCondition_16;
  int local_8a0;
  bool local_899;
  int64_t iStack_898;
  bool _kj_shouldLog_15;
  int local_890;
  DebugExpression<int> local_88c;
  undefined1 local_888 [8];
  DebugComparison<int,_long> _kjCondition_15;
  Builder sub_2;
  bool local_819;
  undefined1 local_818 [7];
  bool _kj_shouldLog_14;
  char (*local_800) [4];
  undefined1 local_7f8 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_14;
  int local_7b8;
  bool local_7b1;
  int64_t iStack_7b0;
  bool _kj_shouldLog_13;
  int local_7a8;
  DebugExpression<int> local_7a4;
  undefined1 local_7a0 [8];
  DebugComparison<int,_long> _kjCondition_13;
  undefined1 local_760 [8];
  BuilderFor<capnproto_test::capnp::test::TestOldVersion> oldVersion_1;
  bool local_729;
  unsigned_long uStack_728;
  bool _kj_shouldLog_12;
  DebugExpression<unsigned_long> local_720;
  undefined1 local_718 [8];
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition_12;
  size_t local_6e0;
  size_t size5;
  ArrayPtr<const_char> local_6c8;
  ArrayPtr<const_char> local_6b8;
  ArrayPtr<const_char> local_6a8;
  Builder local_698;
  bool local_679;
  undefined1 local_678 [7];
  bool _kj_shouldLog_11;
  char (*local_660) [4];
  undefined1 local_658 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_11;
  int local_618;
  bool local_611;
  int64_t iStack_610;
  bool _kj_shouldLog_10;
  int local_608;
  DebugExpression<int> local_604;
  undefined1 local_600 [8];
  DebugComparison<int,_long> _kjCondition_10;
  bool local_5b9;
  undefined1 local_5b8 [7];
  bool _kj_shouldLog_9;
  char (*local_5a0) [4];
  undefined1 local_598 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_9;
  int local_558;
  bool local_551;
  int64_t iStack_550;
  bool _kj_shouldLog_8;
  int local_548;
  DebugExpression<int> local_544;
  undefined1 local_540 [8];
  DebugComparison<int,_long> _kjCondition_8;
  bool local_4f9;
  undefined1 local_4f8 [7];
  bool _kj_shouldLog_7;
  char (*local_4e0) [4];
  undefined1 local_4d8 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_7;
  int local_498;
  bool local_491;
  int64_t iStack_490;
  bool _kj_shouldLog_6;
  int local_488;
  DebugExpression<int> local_484;
  undefined1 local_480 [8];
  DebugComparison<int,_long> _kjCondition_6;
  bool local_439;
  undefined1 local_438 [7];
  bool _kj_shouldLog_5;
  char (*local_420) [4];
  undefined1 local_418 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_5;
  int local_3d8;
  bool local_3d1;
  int64_t iStack_3d0;
  bool _kj_shouldLog_4;
  int local_3c8;
  DebugExpression<int> local_3c4;
  undefined1 local_3c0 [8];
  DebugComparison<int,_long> _kjCondition_4;
  bool local_389;
  unsigned_long uStack_388;
  bool _kj_shouldLog_3;
  DebugExpression<unsigned_long> local_380;
  undefined1 local_378 [8];
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition_3;
  undefined1 local_340 [8];
  Builder sub_1;
  bool local_309;
  unsigned_long uStack_308;
  bool _kj_shouldLog_2;
  DebugExpression<unsigned_long> local_300;
  undefined1 local_2f8 [8];
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition_2;
  size_t local_2c0;
  size_t size3;
  undefined1 local_2a0 [8];
  BuilderFor<capnproto_test::capnp::test::TestNewVersion> newVersion;
  size_t size4;
  bool local_261;
  unsigned_long uStack_260;
  bool _kj_shouldLog_1;
  DebugExpression<unsigned_long> local_258;
  undefined1 local_250 [8];
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition_1;
  size_t local_218;
  size_t size2;
  undefined1 local_200 [8];
  Builder sub;
  Builder local_1c8;
  undefined1 local_1b0 [8];
  BuilderFor<capnproto_test::capnp::test::TestOldVersion> oldVersion;
  uint local_180;
  DebugExpression<unsigned_int> DStack_17c;
  bool _kj_shouldLog;
  undefined1 local_178 [8];
  DebugComparison<unsigned_int,_unsigned_long_&> _kjCondition;
  size_t local_140;
  size_t size;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase881 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder((MallocMessageBuilder *)this_00,0,FIXED_SIZE);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  AVar2 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  _kjCondition._32_8_ = AVar2.ptr;
  local_140 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition.result);
  local_180 = 2;
  DStack_17c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_180);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_long_&> *)local_178,&stack0xfffffffffffffe84,
             &local_140);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_178);
  if (!bVar1) {
    oldVersion._builder._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (oldVersion._builder._39_1_ != '\0') {
      oldVersion._builder.dataSize = 2;
      kj::_::Debug::
      log<char_const(&)[32],kj::_::DebugComparison<unsigned_int,unsigned_long&>&,unsigned_int,unsigned_long&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x37b,ERROR,"\"failed: expected \" \"(2u) == (size)\", _kjCondition, 2u, size",
                 (char (*) [32])"failed: expected (2u) == (size)",
                 (DebugComparison<unsigned_int,_unsigned_long_&> *)local_178,
                 &oldVersion._builder.dataSize,&local_140);
      oldVersion._builder._39_1_ = 0;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_1c8,(Builder *)local_128);
  AnyPointer::Builder::initAs<capnproto_test::capnp::test::TestOldVersion>
            ((BuilderFor<capnproto_test::capnp::test::TestOldVersion> *)local_1b0,&local_1c8);
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld1((Builder *)local_1b0,0x7b);
  Text::Reader::Reader((Reader *)&sub._builder.dataSize,"foo");
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2
            ((Builder *)local_1b0,(Reader)stack0xfffffffffffffe28);
  capnproto_test::capnp::test::TestOldVersion::Builder::initOld3
            ((Builder *)local_200,(Builder *)local_1b0);
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld1((Builder *)local_200,0x1c8);
  Text::Reader::Reader((Reader *)&size2,"bar");
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2((Builder *)local_200,(Reader)_size2)
  ;
  AVar2 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  _kjCondition_1._32_8_ = AVar2.ptr;
  local_218 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition_1.result)
  ;
  uStack_260 = local_140 + 4;
  local_258 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffda0);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long_&> *)local_250,&local_258,&local_218);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_250);
  if (!bVar1) {
    local_261 = kj::_::Debug::shouldLog(ERROR);
    while (local_261 != false) {
      size4 = local_140 + 4;
      kj::_::Debug::
      log<char_const(&)[39],kj::_::DebugComparison<unsigned_long,unsigned_long&>&,unsigned_long,unsigned_long&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x388,ERROR,
                 "\"failed: expected \" \"(size + 4) == (size2)\", _kjCondition, size + 4, size2",
                 (char (*) [39])"failed: expected (size + 4) == (size2)",
                 (DebugComparison<unsigned_long,_unsigned_long_&> *)local_250,&size4,&local_218);
      local_261 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&size3,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestNewVersion>
            ((BuilderFor<capnproto_test::capnp::test::TestNewVersion> *)local_2a0,(Builder *)&size3)
  ;
  AVar2 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  _kjCondition_2._32_8_ = AVar2.ptr;
  local_2c0 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition_2.result)
  ;
  uStack_308 = local_218 + 1;
  local_300 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffcf8);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long_&> *)local_2f8,&local_300,&local_2c0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2f8);
  if (!bVar1) {
    local_309 = kj::_::Debug::shouldLog(ERROR);
    while (local_309 != false) {
      sub_1._builder._32_8_ = local_218 + 1;
      kj::_::Debug::
      log<char_const(&)[40],kj::_::DebugComparison<unsigned_long,unsigned_long&>&,unsigned_long,unsigned_long&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x391,ERROR,
                 "\"failed: expected \" \"(size2 + 1) == (size3)\", _kjCondition, size2 + 1, size3",
                 (char (*) [40])"failed: expected (size2 + 1) == (size3)",
                 (DebugComparison<unsigned_long,_unsigned_long_&> *)local_2f8,
                 (unsigned_long *)&sub_1._builder.dataSize,&local_2c0);
      local_309 = false;
    }
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld3
            ((Builder *)local_340,(Builder *)local_2a0);
  AVar2 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  _kjCondition_3._32_8_ = AVar2.ptr;
  newVersion._builder._32_8_ =
       kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                 ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition_3.result);
  uStack_388 = local_2c0 + 1;
  local_380 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffc78);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long_&> *)local_378,&local_380,
             (unsigned_long *)&newVersion._builder.dataSize);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_378);
  if (!bVar1) {
    local_389 = kj::_::Debug::shouldLog(ERROR);
    while (local_389 != false) {
      _kjCondition_4._32_8_ = local_2c0 + 1;
      kj::_::Debug::
      log<char_const(&)[40],kj::_::DebugComparison<unsigned_long,unsigned_long&>&,unsigned_long,unsigned_long&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x397,ERROR,
                 "\"failed: expected \" \"(size3 + 1) == (size4)\", _kjCondition, size3 + 1, size4",
                 (char (*) [40])"failed: expected (size3 + 1) == (size4)",
                 (DebugComparison<unsigned_long,_unsigned_long_&> *)local_378,
                 (unsigned_long *)&_kjCondition_4.result,
                 (unsigned_long *)&newVersion._builder.dataSize);
      local_389 = false;
    }
  }
  local_3c8 = 0x7b;
  local_3c4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3c8);
  iStack_3d0 = capnproto_test::capnp::test::TestNewVersion::Builder::getOld1((Builder *)local_2a0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_long> *)local_3c0,&local_3c4,&stack0xfffffffffffffc30);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3c0);
  if (!bVar1) {
    local_3d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3d1 != false) {
      local_3d8 = 0x7b;
      _kjCondition_5._48_8_ =
           capnproto_test::capnp::test::TestNewVersion::Builder::getOld1((Builder *)local_2a0);
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x39a,ERROR,
                 "\"failed: expected \" \"(123) == (newVersion.getOld1())\", _kjCondition, 123, newVersion.getOld1()"
                 ,(char (*) [49])"failed: expected (123) == (newVersion.getOld1())",
                 (DebugComparison<int,_long> *)local_3c0,&local_3d8,(long *)&_kjCondition_5.result);
      local_3d1 = false;
    }
  }
  local_420 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
            ((Builder *)local_438,(Builder *)local_2a0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_418,
             (DebugExpression<char_const(&)[4]> *)&local_420,(Builder *)local_438);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_418);
  if (!bVar1) {
    local_439 = kj::_::Debug::shouldLog(ERROR);
    while (local_439 != false) {
      capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
                ((Builder *)&_kjCondition_6.result,(Builder *)local_2a0);
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x39b,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (newVersion.getOld2())\", _kjCondition, \"foo\", newVersion.getOld2()"
                 ,(char (*) [51])"failed: expected (\"foo\") == (newVersion.getOld2())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_418,
                 (char (*) [4])"foo",(Builder *)&_kjCondition_6.result);
      local_439 = false;
    }
  }
  local_488 = 0x3db;
  local_484 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_488);
  iStack_490 = capnproto_test::capnp::test::TestNewVersion::Builder::getNew1((Builder *)local_2a0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_long> *)local_480,&local_484,&stack0xfffffffffffffb70);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_480);
  if (!bVar1) {
    local_491 = kj::_::Debug::shouldLog(ERROR);
    while (local_491 != false) {
      local_498 = 0x3db;
      _kjCondition_7._48_8_ =
           capnproto_test::capnp::test::TestNewVersion::Builder::getNew1((Builder *)local_2a0);
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x39c,ERROR,
                 "\"failed: expected \" \"(987) == (newVersion.getNew1())\", _kjCondition, 987, newVersion.getNew1()"
                 ,(char (*) [49])"failed: expected (987) == (newVersion.getNew1())",
                 (DebugComparison<int,_long> *)local_480,&local_498,(long *)&_kjCondition_7.result);
      local_491 = false;
    }
  }
  local_4e0 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x442cda);
  capnproto_test::capnp::test::TestNewVersion::Builder::getNew2
            ((Builder *)local_4f8,(Builder *)local_2a0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_4d8,
             (DebugExpression<char_const(&)[4]> *)&local_4e0,(Builder *)local_4f8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4d8);
  if (!bVar1) {
    local_4f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_4f9 != false) {
      capnproto_test::capnp::test::TestNewVersion::Builder::getNew2
                ((Builder *)&_kjCondition_8.result,(Builder *)local_2a0);
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x39d,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (newVersion.getNew2())\", _kjCondition, \"baz\", newVersion.getNew2()"
                 ,(char (*) [51])"failed: expected (\"baz\") == (newVersion.getNew2())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_4d8,
                 (char (*) [4])0x442cda,(Builder *)&_kjCondition_8.result);
      local_4f9 = false;
    }
  }
  local_548 = 0x1c8;
  local_544 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_548);
  iStack_550 = capnproto_test::capnp::test::TestNewVersion::Builder::getOld1((Builder *)local_340);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_long> *)local_540,&local_544,&stack0xfffffffffffffab0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_540);
  if (!bVar1) {
    local_551 = kj::_::Debug::shouldLog(ERROR);
    while (local_551 != false) {
      local_558 = 0x1c8;
      _kjCondition_9._48_8_ =
           capnproto_test::capnp::test::TestNewVersion::Builder::getOld1((Builder *)local_340);
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x39f,ERROR,
                 "\"failed: expected \" \"(456) == (sub.getOld1())\", _kjCondition, 456, sub.getOld1()"
                 ,(char (*) [42])"failed: expected (456) == (sub.getOld1())",
                 (DebugComparison<int,_long> *)local_540,&local_558,(long *)&_kjCondition_9.result);
      local_551 = false;
    }
  }
  local_5a0 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x439e6e);
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
            ((Builder *)local_5b8,(Builder *)local_340);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_598,
             (DebugExpression<char_const(&)[4]> *)&local_5a0,(Builder *)local_5b8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_598);
  if (!bVar1) {
    local_5b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_5b9 != false) {
      capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
                ((Builder *)&_kjCondition_10.result,(Builder *)local_340);
      kj::_::Debug::
      log<char_const(&)[44],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3a0,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (sub.getOld2())\", _kjCondition, \"bar\", sub.getOld2()"
                 ,(char (*) [44])"failed: expected (\"bar\") == (sub.getOld2())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_598,
                 (char (*) [4])0x439e6e,(Builder *)&_kjCondition_10.result);
      local_5b9 = false;
    }
  }
  local_608 = 0x3db;
  local_604 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_608);
  iStack_610 = capnproto_test::capnp::test::TestNewVersion::Builder::getNew1((Builder *)local_340);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_long> *)local_600,&local_604,&stack0xfffffffffffff9f0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_600);
  if (!bVar1) {
    local_611 = kj::_::Debug::shouldLog(ERROR);
    while (local_611 != false) {
      local_618 = 0x3db;
      _kjCondition_11._48_8_ =
           capnproto_test::capnp::test::TestNewVersion::Builder::getNew1((Builder *)local_340);
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3a1,ERROR,
                 "\"failed: expected \" \"(987) == (sub.getNew1())\", _kjCondition, 987, sub.getNew1()"
                 ,(char (*) [42])"failed: expected (987) == (sub.getNew1())",
                 (DebugComparison<int,_long> *)local_600,&local_618,(long *)&_kjCondition_11.result)
      ;
      local_611 = false;
    }
  }
  local_660 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x442cda);
  capnproto_test::capnp::test::TestNewVersion::Builder::getNew2
            ((Builder *)local_678,(Builder *)local_340);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_658,
             (DebugExpression<char_const(&)[4]> *)&local_660,(Builder *)local_678);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_658);
  if (!bVar1) {
    local_679 = kj::_::Debug::shouldLog(ERROR);
    while (local_679 != false) {
      capnproto_test::capnp::test::TestNewVersion::Builder::getNew2(&local_698,(Builder *)local_340)
      ;
      kj::_::Debug::
      log<char_const(&)[44],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3a2,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (sub.getNew2())\", _kjCondition, \"baz\", sub.getNew2()"
                 ,(char (*) [44])"failed: expected (\"baz\") == (sub.getNew2())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_658,
                 (char (*) [4])0x442cda,&local_698);
      local_679 = false;
    }
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::setOld1((Builder *)local_2a0,0xea);
  Text::Reader::Reader((Reader *)&local_6a8,"qux");
  capnproto_test::capnp::test::TestNewVersion::Builder::setOld2
            ((Builder *)local_2a0,(Reader)local_6a8);
  capnproto_test::capnp::test::TestNewVersion::Builder::setNew1((Builder *)local_2a0,0x141);
  Text::Reader::Reader((Reader *)&local_6b8,"quux");
  capnproto_test::capnp::test::TestNewVersion::Builder::setNew2
            ((Builder *)local_2a0,(Reader)local_6b8);
  capnproto_test::capnp::test::TestNewVersion::Builder::setOld1((Builder *)local_340,0x237);
  Text::Reader::Reader((Reader *)&local_6c8,"corge");
  capnproto_test::capnp::test::TestNewVersion::Builder::setOld2
            ((Builder *)local_340,(Reader)local_6c8);
  capnproto_test::capnp::test::TestNewVersion::Builder::setNew1((Builder *)local_340,0x28e);
  Text::Reader::Reader((Reader *)&size5,"grault");
  capnproto_test::capnp::test::TestNewVersion::Builder::setNew2((Builder *)local_340,(Reader)_size5)
  ;
  AVar2 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  _kjCondition_12._32_8_ = AVar2.ptr;
  local_6e0 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition_12.result
                        );
  uStack_728 = newVersion._builder._32_8_ + 6;
  local_720 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff8d8);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long_&> *)local_718,&local_720,&local_6e0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_718);
  if (!bVar1) {
    local_729 = kj::_::Debug::shouldLog(ERROR);
    while (local_729 != false) {
      oldVersion_1._builder._32_8_ = newVersion._builder._32_8_ + 6;
      kj::_::Debug::
      log<char_const(&)[40],kj::_::DebugComparison<unsigned_long,unsigned_long&>&,unsigned_long,unsigned_long&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3b1,ERROR,
                 "\"failed: expected \" \"(size4 + 6) == (size5)\", _kjCondition, size4 + 6, size5",
                 (char (*) [40])"failed: expected (size4 + 6) == (size5)",
                 (DebugComparison<unsigned_long,_unsigned_long_&> *)local_718,
                 (unsigned_long *)&oldVersion_1._builder.dataSize,&local_6e0);
      local_729 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition_13.result,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestOldVersion>
            ((BuilderFor<capnproto_test::capnp::test::TestOldVersion> *)local_760,
             (Builder *)&_kjCondition_13.result);
  local_7a8 = 0xea;
  local_7a4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_7a8);
  iStack_7b0 = capnproto_test::capnp::test::TestOldVersion::Builder::getOld1((Builder *)local_760);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_long> *)local_7a0,&local_7a4,&stack0xfffffffffffff850);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_7a0);
  if (!bVar1) {
    local_7b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_7b1 != false) {
      local_7b8 = 0xea;
      _kjCondition_14._48_8_ =
           capnproto_test::capnp::test::TestOldVersion::Builder::getOld1((Builder *)local_760);
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3b6,ERROR,
                 "\"failed: expected \" \"(234) == (oldVersion.getOld1())\", _kjCondition, 234, oldVersion.getOld1()"
                 ,(char (*) [49])"failed: expected (234) == (oldVersion.getOld1())",
                 (DebugComparison<int,_long> *)local_7a0,&local_7b8,(long *)&_kjCondition_14.result)
      ;
      local_7b1 = false;
    }
  }
  local_800 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x449792);
  capnproto_test::capnp::test::TestOldVersion::Builder::getOld2
            ((Builder *)local_818,(Builder *)local_760);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_7f8,
             (DebugExpression<char_const(&)[4]> *)&local_800,(Builder *)local_818);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_7f8);
  if (!bVar1) {
    local_819 = kj::_::Debug::shouldLog(ERROR);
    while (local_819 != false) {
      capnproto_test::capnp::test::TestOldVersion::Builder::getOld2
                ((Builder *)&sub_2._builder.dataSize,(Builder *)local_760);
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3b7,ERROR,
                 "\"failed: expected \" \"(\\\"qux\\\") == (oldVersion.getOld2())\", _kjCondition, \"qux\", oldVersion.getOld2()"
                 ,(char (*) [51])"failed: expected (\"qux\") == (oldVersion.getOld2())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_7f8,
                 (char (*) [4])0x449792,(Builder *)&sub_2._builder.dataSize);
      local_819 = false;
    }
  }
  capnproto_test::capnp::test::TestOldVersion::Builder::getOld3
            ((Builder *)&_kjCondition_15.result,(Builder *)local_760);
  local_890 = 0x237;
  local_88c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_890);
  iStack_898 = capnproto_test::capnp::test::TestOldVersion::Builder::getOld1
                         ((Builder *)&_kjCondition_15.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_long> *)local_888,&local_88c,&stack0xfffffffffffff768);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_888);
  if (!bVar1) {
    local_899 = kj::_::Debug::shouldLog(ERROR);
    while (local_899 != false) {
      local_8a0 = 0x237;
      _kjCondition_16._48_8_ =
           capnproto_test::capnp::test::TestOldVersion::Builder::getOld1
                     ((Builder *)&_kjCondition_15.result);
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3ba,ERROR,
                 "\"failed: expected \" \"(567) == (sub.getOld1())\", _kjCondition, 567, sub.getOld1()"
                 ,(char (*) [42])"failed: expected (567) == (sub.getOld1())",
                 (DebugComparison<int,_long> *)local_888,&local_8a0,(long *)&_kjCondition_16.result)
      ;
      local_899 = false;
    }
  }
  local_8e8 = (char (*) [6])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [6])"corge");
  capnproto_test::capnp::test::TestOldVersion::Builder::getOld2
            ((Builder *)local_900,(Builder *)&_kjCondition_15.result);
  kj::_::DebugExpression<char_const(&)[6]>::operator==
            ((DebugComparison<const_char_(&)[6],_capnp::Text::Builder> *)local_8e0,
             (DebugExpression<char_const(&)[6]> *)&local_8e8,(Builder *)local_900);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_8e0);
  if (!bVar1) {
    local_901 = kj::_::Debug::shouldLog(ERROR);
    while (local_901 != false) {
      capnproto_test::capnp::test::TestOldVersion::Builder::getOld2
                (&local_920,(Builder *)&_kjCondition_15.result);
      kj::_::Debug::
      log<char_const(&)[46],kj::_::DebugComparison<char_const(&)[6],capnp::Text::Builder>&,char_const(&)[6],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3bb,ERROR,
                 "\"failed: expected \" \"(\\\"corge\\\") == (sub.getOld2())\", _kjCondition, \"corge\", sub.getOld2()"
                 ,(char (*) [46])"failed: expected (\"corge\") == (sub.getOld2())",
                 (DebugComparison<const_char_(&)[6],_capnp::Text::Builder> *)local_8e0,
                 (char (*) [6])"corge",&local_920);
      local_901 = false;
    }
  }
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld1((Builder *)local_760,0x159);
  Text::Reader::Reader((Reader *)&local_930,"garply");
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2
            ((Builder *)local_760,(Reader)local_930);
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld1
            ((Builder *)&_kjCondition_15.result,0x2a6);
  Text::Reader::Reader((Reader *)&size6,"waldo");
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2
            ((Builder *)&_kjCondition_15.result,(Reader)_size6);
  AVar2 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  _kjCondition_17._32_8_ = AVar2.ptr;
  local_948 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition_17.result
                        );
  uStack_990 = local_6e0 + 2;
  local_988 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff670);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long_&> *)local_980,&local_988,&local_948);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_980);
  if (!bVar1) {
    local_991 = kj::_::Debug::shouldLog(ERROR);
    while (local_991 != false) {
      newVersion_1._builder._32_8_ = local_6e0 + 2;
      kj::_::Debug::
      log<char_const(&)[40],kj::_::DebugComparison<unsigned_long,unsigned_long&>&,unsigned_long,unsigned_long&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3c6,ERROR,
                 "\"failed: expected \" \"(size5 + 2) == (size6)\", _kjCondition, size5 + 2, size6",
                 (char (*) [40])"failed: expected (size5 + 2) == (size6)",
                 (DebugComparison<unsigned_long,_unsigned_long_&> *)local_980,
                 (unsigned_long *)&newVersion_1._builder.dataSize,&local_948);
      local_991 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&_kjCondition_18.result,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnproto_test::capnp::test::TestNewVersion>
            ((BuilderFor<capnproto_test::capnp::test::TestNewVersion> *)local_9c8,
             (Builder *)&_kjCondition_18.result);
  local_a10 = 0x159;
  local_a0c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_a10);
  iStack_a18 = capnproto_test::capnp::test::TestNewVersion::Builder::getOld1((Builder *)local_9c8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_long> *)local_a08,&local_a0c,&stack0xfffffffffffff5e8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a08);
  if (!bVar1) {
    local_a19 = kj::_::Debug::shouldLog(ERROR);
    while (local_a19 != false) {
      local_a20 = 0x159;
      _kjCondition_19._48_8_ =
           capnproto_test::capnp::test::TestNewVersion::Builder::getOld1((Builder *)local_9c8);
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3cb,ERROR,
                 "\"failed: expected \" \"(345) == (newVersion.getOld1())\", _kjCondition, 345, newVersion.getOld1()"
                 ,(char (*) [49])"failed: expected (345) == (newVersion.getOld1())",
                 (DebugComparison<int,_long> *)local_a08,&local_a20,(long *)&_kjCondition_19.result)
      ;
      local_a19 = false;
    }
  }
  local_a68 = (char (*) [7])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [7])"garply");
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
            ((Builder *)local_a80,(Builder *)local_9c8);
  kj::_::DebugExpression<char_const(&)[7]>::operator==
            ((DebugComparison<const_char_(&)[7],_capnp::Text::Builder> *)local_a60,
             (DebugExpression<char_const(&)[7]> *)&local_a68,(Builder *)local_a80);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a60);
  if (!bVar1) {
    local_a81 = kj::_::Debug::shouldLog(ERROR);
    while (local_a81 != false) {
      capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
                ((Builder *)&_kjCondition_20.result,(Builder *)local_9c8);
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<char_const(&)[7],capnp::Text::Builder>&,char_const(&)[7],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3cc,ERROR,
                 "\"failed: expected \" \"(\\\"garply\\\") == (newVersion.getOld2())\", _kjCondition, \"garply\", newVersion.getOld2()"
                 ,(char (*) [54])"failed: expected (\"garply\") == (newVersion.getOld2())",
                 (DebugComparison<const_char_(&)[7],_capnp::Text::Builder> *)local_a60,
                 (char (*) [7])"garply",(Builder *)&_kjCondition_20.result);
      local_a81 = false;
    }
  }
  local_ad0 = 0x141;
  local_acc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_ad0);
  iStack_ad8 = capnproto_test::capnp::test::TestNewVersion::Builder::getNew1((Builder *)local_9c8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_long> *)local_ac8,&local_acc,&stack0xfffffffffffff528);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_ac8);
  if (!bVar1) {
    local_ad9 = kj::_::Debug::shouldLog(ERROR);
    while (local_ad9 != false) {
      local_ae0 = 0x141;
      _kjCondition_21._48_8_ =
           capnproto_test::capnp::test::TestNewVersion::Builder::getNew1((Builder *)local_9c8);
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3cd,ERROR,
                 "\"failed: expected \" \"(321) == (newVersion.getNew1())\", _kjCondition, 321, newVersion.getNew1()"
                 ,(char (*) [49])"failed: expected (321) == (newVersion.getNew1())",
                 (DebugComparison<int,_long> *)local_ac8,&local_ae0,(long *)&_kjCondition_21.result)
      ;
      local_ad9 = false;
    }
  }
  local_b28 = (char (*) [5])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [5])0x449799);
  capnproto_test::capnp::test::TestNewVersion::Builder::getNew2
            ((Builder *)local_b40,(Builder *)local_9c8);
  kj::_::DebugExpression<char_const(&)[5]>::operator==
            ((DebugComparison<const_char_(&)[5],_capnp::Text::Builder> *)local_b20,
             (DebugExpression<char_const(&)[5]> *)&local_b28,(Builder *)local_b40);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b20);
  if (!bVar1) {
    local_b41 = kj::_::Debug::shouldLog(ERROR);
    while (local_b41 != false) {
      capnproto_test::capnp::test::TestNewVersion::Builder::getNew2
                ((Builder *)&sub_3._builder.dataSize,(Builder *)local_9c8);
      kj::_::Debug::
      log<char_const(&)[52],kj::_::DebugComparison<char_const(&)[5],capnp::Text::Builder>&,char_const(&)[5],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3ce,ERROR,
                 "\"failed: expected \" \"(\\\"quux\\\") == (newVersion.getNew2())\", _kjCondition, \"quux\", newVersion.getNew2()"
                 ,(char (*) [52])"failed: expected (\"quux\") == (newVersion.getNew2())",
                 (DebugComparison<const_char_(&)[5],_capnp::Text::Builder> *)local_b20,
                 (char (*) [5])0x449799,(Builder *)&sub_3._builder.dataSize);
      local_b41 = false;
    }
  }
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld3
            ((Builder *)&_kjCondition_22.result,(Builder *)local_9c8);
  local_bb8 = 0x2a6;
  local_bb4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_bb8);
  iStack_bc0 = capnproto_test::capnp::test::TestNewVersion::Builder::getOld1
                         ((Builder *)&_kjCondition_22.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_long> *)local_bb0,&local_bb4,&stack0xfffffffffffff440);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_bb0);
  if (!bVar1) {
    local_bc1 = kj::_::Debug::shouldLog(ERROR);
    while (local_bc1 != false) {
      local_bc8 = 0x2a6;
      _kjCondition_23._48_8_ =
           capnproto_test::capnp::test::TestNewVersion::Builder::getOld1
                     ((Builder *)&_kjCondition_22.result);
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3d1,ERROR,
                 "\"failed: expected \" \"(678) == (sub.getOld1())\", _kjCondition, 678, sub.getOld1()"
                 ,(char (*) [42])"failed: expected (678) == (sub.getOld1())",
                 (DebugComparison<int,_long> *)local_bb0,&local_bc8,(long *)&_kjCondition_23.result)
      ;
      local_bc1 = false;
    }
  }
  local_c10 = (char (*) [6])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [6])"waldo");
  capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
            ((Builder *)local_c28,(Builder *)&_kjCondition_22.result);
  kj::_::DebugExpression<char_const(&)[6]>::operator==
            ((DebugComparison<const_char_(&)[6],_capnp::Text::Builder> *)local_c08,
             (DebugExpression<char_const(&)[6]> *)&local_c10,(Builder *)local_c28);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c08);
  if (!bVar1) {
    local_c29 = kj::_::Debug::shouldLog(ERROR);
    while (local_c29 != false) {
      capnproto_test::capnp::test::TestNewVersion::Builder::getOld2
                ((Builder *)&_kjCondition_24.result,(Builder *)&_kjCondition_22.result);
      kj::_::Debug::
      log<char_const(&)[46],kj::_::DebugComparison<char_const(&)[6],capnp::Text::Builder>&,char_const(&)[6],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3d2,ERROR,
                 "\"failed: expected \" \"(\\\"waldo\\\") == (sub.getOld2())\", _kjCondition, \"waldo\", sub.getOld2()"
                 ,(char (*) [46])"failed: expected (\"waldo\") == (sub.getOld2())",
                 (DebugComparison<const_char_(&)[6],_capnp::Text::Builder> *)local_c08,
                 (char (*) [6])"waldo",(Builder *)&_kjCondition_24.result);
      local_c29 = false;
    }
  }
  local_c78 = 0x28e;
  local_c74 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c78);
  iStack_c80 = capnproto_test::capnp::test::TestNewVersion::Builder::getNew1
                         ((Builder *)&_kjCondition_22.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_long> *)local_c70,&local_c74,&stack0xfffffffffffff380);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c70);
  if (!bVar1) {
    local_c81 = kj::_::Debug::shouldLog(ERROR);
    while (local_c81 != false) {
      local_c88 = 0x28e;
      _kjCondition_25._48_8_ =
           capnproto_test::capnp::test::TestNewVersion::Builder::getNew1
                     ((Builder *)&_kjCondition_22.result);
      kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,long>&,int,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3d3,ERROR,
                 "\"failed: expected \" \"(654) == (sub.getNew1())\", _kjCondition, 654, sub.getNew1()"
                 ,(char (*) [42])"failed: expected (654) == (sub.getNew1())",
                 (DebugComparison<int,_long> *)local_c70,&local_c88,(long *)&_kjCondition_25.result)
      ;
      local_c81 = false;
    }
  }
  local_cd0 = (char (*) [7])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [7])"grault");
  capnproto_test::capnp::test::TestNewVersion::Builder::getNew2
            ((Builder *)local_ce8,(Builder *)&_kjCondition_22.result);
  kj::_::DebugExpression<char_const(&)[7]>::operator==
            ((DebugComparison<const_char_(&)[7],_capnp::Text::Builder> *)local_cc8,
             (DebugExpression<char_const(&)[7]> *)&local_cd0,(Builder *)local_ce8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_cc8);
  if (!bVar1) {
    local_ce9 = kj::_::Debug::shouldLog(ERROR);
    while (local_ce9 != false) {
      capnproto_test::capnp::test::TestNewVersion::Builder::getNew2
                ((Builder *)&_kjCondition_26.result,(Builder *)&_kjCondition_22.result);
      kj::_::Debug::
      log<char_const(&)[47],kj::_::DebugComparison<char_const(&)[7],capnp::Text::Builder>&,char_const(&)[7],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3d4,ERROR,
                 "\"failed: expected \" \"(\\\"grault\\\") == (sub.getNew2())\", _kjCondition, \"grault\", sub.getNew2()"
                 ,(char (*) [47])"failed: expected (\"grault\") == (sub.getNew2())",
                 (DebugComparison<const_char_(&)[7],_capnp::Text::Builder> *)local_cc8,
                 (char (*) [7])"grault",(Builder *)&_kjCondition_26.result);
      local_ce9 = false;
    }
  }
  local_d38 = (unsigned_long *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_948);
  _auStack_d50 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  local_d40 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_d50);
  kj::_::DebugExpression<unsigned_long&>::operator==
            ((DebugComparison<unsigned_long_&,_unsigned_long> *)local_d30,
             (DebugExpression<unsigned_long&> *)&local_d38,&local_d40);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d30);
  if (!bVar1) {
    local_d51 = kj::_::Debug::shouldLog(ERROR);
    while (local_d51 != false) {
      AVar2 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
      local_d70 = AVar2;
      local_d60 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size(&local_d70);
      kj::_::Debug::
      log<char_const(&)[68],kj::_::DebugComparison<unsigned_long&,unsigned_long>&,unsigned_long&,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x3d9,ERROR,
                 "\"failed: expected \" \"(size6) == (builder.getSegmentsForOutput().size())\", _kjCondition, size6, builder.getSegmentsForOutput().size()"
                 ,(char (*) [68])
                  "failed: expected (size6) == (builder.getSegmentsForOutput().size())",
                 (DebugComparison<unsigned_long_&,_unsigned_long> *)local_d30,&local_948,&local_d60)
      ;
      local_d51 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Orphans, DisownNull) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  {
    Orphan<TestAllTypes> orphan = root.disownStructField();
    EXPECT_TRUE(orphan == nullptr);

    checkTestMessageAllZero(orphan.getReader());
    EXPECT_TRUE(orphan == nullptr);

    // get()ing the orphan allocates an object, for security reasons.
    checkTestMessageAllZero(orphan.get());
    EXPECT_FALSE(orphan == nullptr);
  }

  {
    Orphan<List<int32_t>> orphan = root.disownInt32List();
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.getReader().size());
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.get().size());
    EXPECT_TRUE(orphan == nullptr);
  }

  {
    Orphan<List<TestAllTypes>> orphan = root.disownStructList();
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.getReader().size());
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.get().size());
    EXPECT_TRUE(orphan == nullptr);
  }
}